

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_4::CommentCollector::Flush(CommentCollector *this)

{
  CommentCollector *this_local;
  
  if ((this->has_comment_ & 1U) != 0) {
    if ((this->can_attach_to_prev_ & 1U) == 0) {
      if (this->detached_comments_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this->detached_comments_,&this->comment_buffer_);
      }
    }
    else {
      if (this->prev_trailing_comments_ != (string *)0x0) {
        std::__cxx11::string::append((string *)this->prev_trailing_comments_);
      }
      this->can_attach_to_prev_ = false;
    }
    ClearBuffer(this);
  }
  return;
}

Assistant:

void Flush() {
    if (has_comment_) {
      if (can_attach_to_prev_) {
        if (prev_trailing_comments_ != NULL) {
          prev_trailing_comments_->append(comment_buffer_);
        }
        can_attach_to_prev_ = false;
      } else {
        if (detached_comments_ != NULL) {
          detached_comments_->push_back(comment_buffer_);
        }
      }
      ClearBuffer();
    }
  }